

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint256.h
# Opt level: O2

optional<uint256> * __thiscall
detail::FromUserHex<uint256>
          (optional<uint256> *__return_storage_ptr__,detail *this,string_view input)

{
  long lVar1;
  detail *this_00;
  char *pcVar2;
  long in_FS_OFFSET;
  string_view prefix;
  string_view str;
  string_view str_00;
  string_view sVar3;
  string padded;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar3._M_str = (char *)input._M_len;
  sVar3._M_len = (size_t)this;
  prefix._M_str = "0x";
  prefix._M_len = 2;
  pcVar2 = "0x";
  sVar3 = util::RemovePrefixView(sVar3,prefix);
  str_00._M_len = sVar3._M_str;
  this_00 = (detail *)sVar3._M_len;
  if (this_00 < (detail *)0x40) {
    padded._M_dataplus._M_p = (pointer)&padded.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&padded,0x40,'0');
    if (this_00 != (detail *)0x0) {
      memmove(padded._M_dataplus._M_p + (0x40 - (long)this_00),str_00._M_len,(size_t)this_00);
    }
    str._M_str = pcVar2;
    str._M_len = (size_t)padded._M_dataplus._M_p;
    FromHex<uint256>(__return_storage_ptr__,(detail *)padded._M_string_length,str);
    std::__cxx11::string::~string((string *)&padded);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return __return_storage_ptr__;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    str_00._M_str = pcVar2;
    FromHex<uint256>(__return_storage_ptr__,this_00,str_00);
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<uintN_t> FromUserHex(std::string_view input)
{
    input = util::RemovePrefixView(input, "0x");
    constexpr auto expected_size{uintN_t::size() * 2};
    if (input.size() < expected_size) {
        auto padded = std::string(expected_size, '0');
        std::copy(input.begin(), input.end(), padded.begin() + expected_size - input.size());
        return FromHex<uintN_t>(padded);
    }
    return FromHex<uintN_t>(input);
}